

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitPLTerm
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,PLTerm e)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  BasicWriter<char> *pBVar4;
  Buffer<char> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  FormatSpec local_48;
  
  pBVar4 = this->writer_;
  pBVar5 = pBVar4->buffer_;
  sVar7 = pBVar5->size_;
  uVar1 = sVar7 + 2;
  if (pBVar5->capacity_ < uVar1) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    sVar7 = pBVar5->size_;
  }
  pcVar6 = pBVar5->ptr_;
  (pcVar6 + sVar7)[0] = '<';
  (pcVar6 + sVar7)[1] = '<';
  pBVar5->size_ = uVar1;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (pBVar4,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x18),&local_48);
  iVar2 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                         impl_ + 4);
  if (1 < (long)iVar2) {
    lVar8 = 0;
    do {
      pBVar4 = this->writer_;
      pBVar5 = pBVar4->buffer_;
      sVar7 = pBVar5->size_;
      uVar1 = sVar7 + 2;
      if (pBVar5->capacity_ < uVar1) {
        (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
        sVar7 = pBVar5->size_;
      }
      pcVar6 = pBVar5->ptr_;
      (pcVar6 + sVar7)[0] = ',';
      (pcVar6 + sVar7)[1] = ' ';
      pBVar5->size_ = uVar1;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (pBVar4,*(double *)
                         ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                super_ExprBase.impl_ + 0x28 + lVar8),&local_48);
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar2 * 0x10 + -0x10 != lVar8);
  }
  pBVar4 = this->writer_;
  pBVar5 = pBVar4->buffer_;
  sVar7 = pBVar5->size_;
  uVar1 = sVar7 + 2;
  if (pBVar5->capacity_ < uVar1) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    sVar7 = pBVar5->size_;
  }
  pcVar6 = pBVar5->ptr_;
  (pcVar6 + sVar7)[0] = ';';
  (pcVar6 + sVar7)[1] = ' ';
  pBVar5->size_ = uVar1;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (pBVar4,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x10),&local_48);
  uVar3 = *(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_ + 4);
  if (0 < (int)uVar3) {
    lVar8 = 0;
    do {
      pBVar4 = this->writer_;
      pBVar5 = pBVar4->buffer_;
      sVar7 = pBVar5->size_;
      uVar1 = sVar7 + 2;
      if (pBVar5->capacity_ < uVar1) {
        (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
        sVar7 = pBVar5->size_;
      }
      pcVar6 = pBVar5->ptr_;
      (pcVar6 + sVar7)[0] = ',';
      (pcVar6 + sVar7)[1] = ' ';
      pBVar5->size_ = uVar1;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (pBVar4,*(double *)
                         ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                super_ExprBase.impl_ + 0x20 + lVar8),&local_48);
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar8);
  }
  pBVar5 = this->writer_->buffer_;
  sVar7 = pBVar5->size_;
  uVar1 = sVar7 + 3;
  if (pBVar5->capacity_ < uVar1) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    sVar7 = pBVar5->size_;
  }
  pcVar6 = pBVar5->ptr_;
  pcVar6[sVar7 + 2] = ' ';
  pcVar6 = pcVar6 + sVar7;
  pcVar6[0] = '>';
  pcVar6[1] = '>';
  pBVar5->size_ = uVar1;
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
             8))->impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitPLTerm(PLTerm e) {
  writer_ << "<<" << e.breakpoint(0);
  for (int i = 1, n = e.num_breakpoints(); i < n; ++i)
    writer_ << ", " << e.breakpoint(i);
  writer_ << "; " << e.slope(0);
  for (int i = 1, n = e.num_slopes(); i < n; ++i)
    writer_ << ", " << e.slope(i);
  writer_ << ">> ";
  Visit( e.arg() );
}